

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarrisCorner.cpp
# Opt level: O2

void harrisCorner(Mat *img,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,
                 int threshold,bool isANMS)

{
  _InputArray *p_Var1;
  pointer pKVar2;
  int in_R8D;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> cornersANMS;
  undefined8 local_850;
  undefined8 local_848;
  undefined8 local_840;
  undefined8 local_838;
  _InputArray local_830 [14];
  Mat localMax;
  long *local_688;
  Mat cNorm;
  undefined8 *local_530;
  Mat c;
  Mat det;
  Mat det2;
  Mat det1;
  Mat GIy2;
  Mat GIx2;
  Mat GIxIy;
  Mat IxIy;
  Mat Iy2;
  Mat Ix2;
  Mat Iy;
  Mat Ix;
  Mat greyImg;
  
  cv::Mat::Mat(&greyImg);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_830[0].obj = img;
  cv::cvtColor((cv *)local_830,(_InputArray *)&localMax,(_OutputArray *)0x6,0,in_R8D);
  cv::Mat::Mat(&Ix);
  cv::Mat::Mat(&Iy);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_830[0].obj = &greyImg;
  cv::Scharr(local_830,(_OutputArray *)&localMax,5,1,0,1.0,0.0,4);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_830[0].obj = &greyImg;
  cv::Scharr(local_830,(_OutputArray *)&localMax,5,0,1,1.0,0.0,4);
  cv::Mat::Mat(&Ix2);
  cv::Mat::Mat(&Iy2);
  cv::Mat::Mat(&IxIy);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_830[0].obj = &Ix;
  cv::pow(local_830,2.0,(_OutputArray *)&localMax);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_830[0].obj = &Iy;
  cv::pow(local_830,2.0,(_OutputArray *)&localMax);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x1010000;
  _GIx2 = 0x2010000;
  local_830[0].obj = &Ix;
  cv::multiply(local_830,(_InputArray *)&localMax,(_OutputArray *)&GIx2,1.0,-1);
  cv::Mat::Mat(&GIx2);
  cv::Mat::Mat(&GIy2);
  cv::Mat::Mat(&GIxIy);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_838 = 0x900000009;
  local_830[0].obj = &Ix2;
  cv::GaussianBlur(0x3ff0000000000000,0);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_840 = 0x900000009;
  local_830[0].obj = &Iy2;
  cv::GaussianBlur(0x3ff0000000000000,0);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_848 = 0x900000009;
  local_830[0].obj = &IxIy;
  cv::GaussianBlur(0x3ff0000000000000,0);
  cv::Mat::Mat(&det);
  cv::Mat::Mat(&det1);
  cv::Mat::Mat(&det2);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x1010000;
  _c = 0x2010000;
  local_830[0].obj = &GIx2;
  cv::multiply(local_830,(_InputArray *)&localMax,(_OutputArray *)&c,1.0,-1);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x2010000;
  local_830[0].obj = &GIxIy;
  cv::pow(local_830,2.0,(_OutputArray *)&localMax);
  cv::operator-((Mat *)local_830,&det1);
  (**(code **)(*(long *)CONCAT44(local_830[0]._4_4_,local_830[0].flags) + 0x18))
            ((long *)CONCAT44(local_830[0]._4_4_,local_830[0].flags),local_830,&det,
             0xffffffffffffffff);
  cv::MatExpr::~MatExpr((MatExpr *)local_830);
  cv::Mat::Mat(&c);
  cv::Mat::Mat(&cNorm);
  cv::operator+(&localMax,&GIx2);
  cv::operator/((Mat *)local_830,(MatExpr *)&det);
  (**(code **)(*(long *)CONCAT44(local_830[0]._4_4_,local_830[0].flags) + 0x18))
            ((long *)CONCAT44(local_830[0]._4_4_,local_830[0].flags),local_830,&c,0xffffffffffffffff
            );
  cv::MatExpr::~MatExpr((MatExpr *)local_830);
  cv::MatExpr::~MatExpr((MatExpr *)&localMax);
  local_830[0].sz.width = 0;
  local_830[0].sz.height = 0;
  local_830[0].flags = 0x1010000;
  _localMax = 0x3010000;
  local_830[0].obj = &c;
  p_Var1 = (_InputArray *)cv::noArray();
  cv::normalize(local_830,(_InputOutputArray *)&localMax,0.0,255.0,0x20,5,p_Var1);
  if (isANMS) {
    cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ANMS(&cNorm,&cornersANMS,threshold);
    local_850 = CONCAT44((int)*local_530,(int)((ulong)*local_530 >> 0x20));
    cv::Mat::zeros(local_830,&local_850,5);
    cv::MatExpr::operator_cast_to_Mat((MatExpr *)&localMax);
    cv::MatExpr::~MatExpr((MatExpr *)local_830);
    for (pKVar2 = cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pKVar2 != cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pKVar2 = pKVar2 + 1) {
      *(float *)((long)(int)ROUND((pKVar2->pt).y) * *local_688 +
                (long)(int)ROUND((pKVar2->pt).x) * 4) = pKVar2->response;
    }
    localMaxima(&localMax,corners,0);
    cv::Mat::~Mat(&localMax);
    std::_Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~_Vector_base
              (&cornersANMS.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>);
  }
  else {
    localMaxima(&cNorm,corners,threshold);
  }
  cv::Mat::~Mat(&cNorm);
  cv::Mat::~Mat(&c);
  cv::Mat::~Mat(&det2);
  cv::Mat::~Mat(&det1);
  cv::Mat::~Mat(&det);
  cv::Mat::~Mat(&GIxIy);
  cv::Mat::~Mat(&GIy2);
  cv::Mat::~Mat(&GIx2);
  cv::Mat::~Mat(&IxIy);
  cv::Mat::~Mat(&Iy2);
  cv::Mat::~Mat(&Ix2);
  cv::Mat::~Mat(&Iy);
  cv::Mat::~Mat(&Ix);
  cv::Mat::~Mat(&greyImg);
  return;
}

Assistant:

void harrisCorner(const Mat& img, vector<KeyPoint>& corners, int threshold, bool isANMS) {
	Mat greyImg;
	cvtColor(img, greyImg, COLOR_BGR2GRAY);
	//GaussianBlur(greyImg, greyImg, Size(3, 3),1);
	Mat Ix, Iy;
	Scharr(greyImg, Ix, CV_32F, 1, 0);
	Scharr(greyImg, Iy, CV_32F, 0, 1);
	Mat Ix2, Iy2, IxIy;
	pow(Ix,2.0,Ix2);
	pow(Iy, 2.0, Iy2);
	multiply(Ix, Iy, IxIy);

	Mat GIx2, GIy2, GIxIy;
	GaussianBlur(Ix2, GIx2, Size(9, 9), 1);
	GaussianBlur(Iy2, GIy2, Size(9, 9), 1);
	GaussianBlur(IxIy, GIxIy, Size(9, 9), 1);

	Mat det, det1, det2;
	multiply(GIx2, GIy2, det1);
	pow(GIxIy, 2.0, det2);
	det = det1 - det2;

	Mat c, cNorm;
	c = det/(GIx2+GIy2);

	normalize(c, cNorm, 0, 255, NORM_MINMAX, CV_32F);
	
	if (isANMS) {
		std::vector<KeyPoint> cornersANMS;
		ANMS(cNorm, cornersANMS, threshold);

		Mat localMax = Mat::zeros(cNorm.size(), CV_32F);
		for (KeyPoint point : cornersANMS) {
			localMax.at<float>(point.pt) = point.response;
		}
		localMaxima(localMax, corners, 0);
	}
	else {
		localMaxima(cNorm, corners, threshold);
	}

}